

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaiser_window.cc
# Opt level: O1

void __thiscall
sptk::KaiserWindow::KaiserWindow(KaiserWindow *this,int window_length,double beta,bool periodic)

{
  double dVar1;
  pointer pdVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  (this->super_WindowInterface)._vptr_WindowInterface = (_func_int **)&PTR__KaiserWindow_00116cf8;
  this->window_length_ = window_length;
  this->beta_ = beta;
  this->periodic_ = periodic;
  this->is_valid_ = true;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((window_length < 1) || (beta < 0.0)) {
    this->is_valid_ = false;
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(&this->window_,(ulong)(uint)window_length);
    if (this->window_length_ == 1) {
      *(this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 1.0;
    }
    else {
      dVar11 = 1.0;
      iVar5 = 1;
      dVar1 = 1.0;
      do {
        dVar11 = ((this->beta_ * 0.5) / (double)iVar5) * dVar11;
        dVar3 = dVar11 * dVar11 + dVar1;
        if (dVar3 - dVar1 < 1e-06) break;
        bVar7 = iVar5 != 499;
        iVar5 = iVar5 + 1;
        dVar1 = dVar3;
      } while (bVar7);
      if (0 < this->window_length_) {
        dVar11 = (double)(int)(this->window_length_ - (this->periodic_ ^ 1)) * 0.5;
        pdVar2 = (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = 0;
        do {
          dVar8 = ((double)(int)lVar6 - dVar11) / dVar11;
          dVar1 = this->beta_;
          dVar8 = 1.0 - dVar8 * dVar8;
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          dVar4 = 1.0;
          dVar9 = 1.0;
          iVar5 = 1;
          do {
            dVar4 = ((dVar1 * dVar8 * 0.5) / (double)iVar5) * dVar4;
            dVar10 = dVar4 * dVar4 + dVar9;
            if (dVar10 - dVar9 < 1e-06) break;
            bVar7 = iVar5 != 499;
            dVar9 = dVar10;
            iVar5 = iVar5 + 1;
          } while (bVar7);
          pdVar2[lVar6] = dVar10 * (1.0 / dVar3);
          lVar6 = lVar6 + 1;
        } while (lVar6 < this->window_length_);
      }
    }
  }
  return;
}

Assistant:

KaiserWindow::KaiserWindow(int window_length, double beta, bool periodic)
    : window_length_(window_length),
      beta_(beta),
      periodic_(periodic),
      is_valid_(true) {
  if (window_length_ <= 0 || beta_ < 0.0) {
    is_valid_ = false;
    return;
  }

  window_.resize(window_length);
  if (1 == window_length_) {
    window_[0] = 1.0;
    return;
  }

  const double a(0.5 * (periodic_ ? window_length_ : window_length_ - 1));
  const double z(1.0 / I0(beta_));
  double* window(&(window_[0]));
  for (int i(0); i < window_length_; ++i) {
    const double x((i - a) / a);
    window[i] = z * I0(beta_ * std::sqrt(1.0 - x * x));
  }
}